

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFunc.c
# Opt level: O3

Abc_Obj_t * Abc_ConvertAigToAig(Abc_Ntk_t *pNtkAig,Abc_Obj_t *pObjOld)

{
  anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 aVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  Abc_Obj_t *pAVar5;
  long lVar6;
  Hop_Obj_t *pObj;
  
  aVar1 = pObjOld->field_5;
  pObj = (Hop_Obj_t *)((ulong)aVar1.pData & 0xfffffffffffffffe);
  if ((*(uint *)&pObj->field_0x20 & 7) == 1) {
    pAVar5 = Abc_AigConst1(pNtkAig);
  }
  else {
    if (0 < (pObjOld->vFanins).nSize) {
      plVar2 = (long *)pObjOld->pNtk->pManFunc;
      lVar6 = 0;
      do {
        lVar3 = *(long *)((long)pObjOld->pNtk->vObjs->pArray[(pObjOld->vFanins).pArray[lVar6]] +
                         0x40);
        if (lVar3 == 0) {
          __assert_fail("pFanin->pCopy != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcFunc.c"
                        ,0x442,"Abc_Obj_t *Abc_ConvertAigToAig(Abc_Ntk_t *, Abc_Obj_t *)");
        }
        lVar4 = *plVar2;
        if (*(int *)(lVar4 + 4) <= lVar6) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        **(long **)(*(long *)(lVar4 + 8) + lVar6 * 8) = lVar3;
        lVar6 = lVar6 + 1;
      } while (lVar6 < (pObjOld->vFanins).nSize);
    }
    Abc_ConvertAigToAig_rec(pNtkAig,pObj);
    Hop_ConeUnmark_rec(pObj);
    pAVar5 = (Abc_Obj_t *)(pObj->field_0).pData;
  }
  return (Abc_Obj_t *)((ulong)(aVar1.iData & 1) ^ (ulong)pAVar5);
}

Assistant:

Abc_Obj_t * Abc_ConvertAigToAig( Abc_Ntk_t * pNtkAig, Abc_Obj_t * pObjOld )
{
    Hop_Man_t * pHopMan;
    Hop_Obj_t * pRoot;
    Abc_Obj_t * pFanin;
    int i;
    // get the local AIG
    pHopMan = (Hop_Man_t *)pObjOld->pNtk->pManFunc;
    pRoot = (Hop_Obj_t *)pObjOld->pData;
    // check the case of a constant
    if ( Hop_ObjIsConst1( Hop_Regular(pRoot) ) )
        return Abc_ObjNotCond( Abc_AigConst1(pNtkAig), Hop_IsComplement(pRoot) );
    // assign the fanin nodes
    Abc_ObjForEachFanin( pObjOld, pFanin, i )
    {
        assert( pFanin->pCopy != NULL );
        Hop_ManPi(pHopMan, i)->pData = pFanin->pCopy;
    }
    // construct the AIG
    Abc_ConvertAigToAig_rec( pNtkAig, Hop_Regular(pRoot) );
    Hop_ConeUnmark_rec( Hop_Regular(pRoot) );
    // return the result
    return Abc_ObjNotCond( (Abc_Obj_t *)Hop_Regular(pRoot)->pData, Hop_IsComplement(pRoot) );  
}